

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0,false>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      end,anon_class_16_2_a9e7a8bd comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_00;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_01;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_02;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_03;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_04;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_05;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_06;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_07;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_08;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_09;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  __b_10;
  anon_class_16_2_a9e7a8bd __comp;
  anon_class_16_2_a9e7a8bd __comp_00;
  anon_class_16_2_a9e7a8bd comp_00;
  anon_class_16_2_a9e7a8bd comp_01;
  anon_class_16_2_a9e7a8bd comp_02;
  anon_class_16_2_a9e7a8bd comp_03;
  anon_class_16_2_a9e7a8bd comp_04;
  anon_class_16_2_a9e7a8bd comp_05;
  anon_class_16_2_a9e7a8bd comp_06;
  anon_class_16_2_a9e7a8bd comp_07;
  anon_class_16_2_a9e7a8bd comp_08;
  anon_class_16_2_a9e7a8bd comp_09;
  anon_class_16_2_a9e7a8bd comp_10;
  anon_class_16_2_a9e7a8bd comp_11;
  bool bVar1;
  bool bVar2;
  difference_type dVar3;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var4;
  difference_type dVar5;
  FractionalInteger *pFVar6;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_RCX;
  FractionalInteger *in_RDX;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_RSI;
  FractionalInteger *in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  pVar7;
  bool highly_unbalanced;
  diff_t r_size;
  diff_t l_size;
  bool already_partitioned;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  pivot_pos;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  part_result;
  diff_t s2;
  diff_t size;
  undefined7 in_stack_fffffffffffffc48;
  undefined1 in_stack_fffffffffffffc4f;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  byte local_391;
  FractionalInteger *in_stack_fffffffffffffc78;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffc80;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffc88;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffc90;
  FractionalInteger *in_stack_fffffffffffffca0;
  FractionalInteger *in_stack_fffffffffffffca8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcb0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcb8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcc0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcc8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcd0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcd8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffce0;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffce8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffcf8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd00;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd08;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  in_stack_fffffffffffffd10;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_158 [3];
  FractionalInteger *local_140;
  FractionalInteger *local_138;
  FractionalInteger *local_130;
  FractionalInteger *local_128;
  FractionalInteger *local_120;
  FractionalInteger *local_108;
  FractionalInteger *local_100;
  FractionalInteger *local_f8;
  FractionalInteger *local_e0;
  FractionalInteger *local_d8;
  FractionalInteger *local_d0;
  FractionalInteger *local_b8;
  FractionalInteger *local_b0;
  FractionalInteger *local_a8;
  FractionalInteger *local_90;
  FractionalInteger *local_88;
  FractionalInteger *local_80;
  long local_78;
  FractionalInteger *local_58;
  FractionalInteger *local_38;
  undefined3 in_stack_ffffffffffffffd8;
  uint uVar8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_8;
  
  uVar8 = CONCAT13(in_R9B,in_stack_ffffffffffffffd8) & 0x1ffffff;
  local_8._M_current = in_RDI;
  do {
    while( true ) {
      dVar3 = __gnu_cxx::operator-
                        ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)in_stack_fffffffffffffc50._M_current,
                         (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
      if (dVar3 < 0x18) {
        if ((uVar8 & 0x1000000) == 0) {
          local_58 = local_8._M_current;
          comp_07.this = (HighsTableauSeparator *)in_stack_fffffffffffffcd0._M_current;
          comp_07.edgeWt = (double **)in_stack_fffffffffffffcc8._M_current;
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                    (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,comp_07);
        }
        else {
          local_38 = local_8._M_current;
          comp_06.this = (HighsTableauSeparator *)in_stack_fffffffffffffcd0._M_current;
          comp_06.edgeWt = (double **)in_stack_fffffffffffffcc8._M_current;
          insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                    (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,comp_06);
        }
        return;
      }
      local_78 = dVar3 / 2;
      if (dVar3 < 0x81) {
        local_130 = (FractionalInteger *)
                    __gnu_cxx::
                    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                                in_stack_fffffffffffffc50._M_current);
        local_138 = local_8._M_current;
        local_140 = (FractionalInteger *)
                    __gnu_cxx::
                    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                                in_stack_fffffffffffffc50._M_current);
        comp_04.this = (HighsTableauSeparator *)in_stack_fffffffffffffca8;
        comp_04.edgeWt = (double **)in_stack_fffffffffffffca0;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_04);
      }
      else {
        local_80 = local_8._M_current;
        local_88 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50._M_current);
        local_90 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50._M_current);
        comp_00.this = (HighsTableauSeparator *)in_stack_fffffffffffffca8;
        comp_00.edgeWt = (double **)in_stack_fffffffffffffca0;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_00);
        local_a8 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50._M_current);
        local_b0 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50._M_current);
        local_b8 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50._M_current);
        comp_01.this = (HighsTableauSeparator *)in_stack_fffffffffffffca8;
        comp_01.edgeWt = (double **)in_stack_fffffffffffffca0;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_01);
        local_d0 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50._M_current);
        local_d8 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50._M_current);
        local_e0 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50._M_current);
        comp_02.this = (HighsTableauSeparator *)in_stack_fffffffffffffca8;
        comp_02.edgeWt = (double **)in_stack_fffffffffffffca0;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_02);
        local_f8 = (FractionalInteger *)
                   __gnu_cxx::
                   __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                               in_stack_fffffffffffffc50._M_current);
        local_100 = (FractionalInteger *)
                    __gnu_cxx::
                    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                                in_stack_fffffffffffffc50._M_current);
        local_108 = (FractionalInteger *)
                    __gnu_cxx::
                    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                                in_stack_fffffffffffffc50._M_current);
        comp_03.this = (HighsTableauSeparator *)in_stack_fffffffffffffca8;
        comp_03.edgeWt = (double **)in_stack_fffffffffffffca0;
        sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_03);
        local_120 = local_8._M_current;
        local_128 = (FractionalInteger *)
                    __gnu_cxx::
                    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                    ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                                in_stack_fffffffffffffc50._M_current);
        _Var4._M_current._7_1_ = in_stack_fffffffffffffc4f;
        _Var4._M_current._0_7_ = in_stack_fffffffffffffc48;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffc50,_Var4);
      }
      local_391 = 0;
      if ((uVar8 & 0x1000000) == 0) {
        local_158[0] = __gnu_cxx::
                       __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                    *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                                   in_stack_fffffffffffffc50._M_current);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator*(local_158);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator*(&local_8);
        bVar1 = HighsTableauSeparator::separateLpSolution::anon_class_16_2_a9e7a8bd::operator()
                          ((anon_class_16_2_a9e7a8bd *)in_stack_fffffffffffffcb0._M_current,
                           in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
        local_391 = bVar1 ^ 0xff;
      }
      if ((local_391 & 1) == 0) break;
      comp_05.this = (HighsTableauSeparator *)in_stack_fffffffffffffcc8._M_current;
      comp_05.edgeWt = (double **)in_stack_fffffffffffffcc0._M_current;
      partition_left<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                (in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,comp_05);
      local_8 = __gnu_cxx::
                __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                             *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                            in_stack_fffffffffffffc50._M_current);
    }
    comp_10.this = (HighsTableauSeparator *)in_stack_fffffffffffffd00._M_current;
    comp_10.edgeWt = (double **)in_stack_fffffffffffffcf8._M_current;
    pVar7 = partition_right<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                      (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,comp_10);
    _Var4 = pVar7.first._M_current;
    dVar5 = __gnu_cxx::operator-
                      ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                        *)in_stack_fffffffffffffc50._M_current,
                       (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                        *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    __gnu_cxx::
    __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
    ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                 *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                (difference_type)in_stack_fffffffffffffc50._M_current);
    pFVar6 = (FractionalInteger *)
             __gnu_cxx::operator-
                       (in_stack_fffffffffffffc50._M_current,
                        (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                         *)CONCAT17(in_stack_fffffffffffffc4f,in_stack_fffffffffffffc48));
    bVar1 = dVar3 / 8 <= dVar5;
    if (bVar1) {
      in_stack_fffffffffffffc50._M_current = pFVar6;
    }
    bVar1 = !bVar1;
    bVar2 = (long)pFVar6 < dVar3 / 8;
    in_stack_fffffffffffffc5f = bVar1 || bVar2;
    if (bVar1 || bVar2) {
      in_R8D = in_R8D + -1;
      if (in_R8D == 0) {
        __comp.this = (HighsTableauSeparator *)in_stack_fffffffffffffc80._M_current;
        __comp.edgeWt = (double **)in_stack_fffffffffffffc78;
        std::
        make_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,__comp);
        __comp_00.this = (HighsTableauSeparator *)in_stack_fffffffffffffc80._M_current;
        __comp_00.edgeWt = (double **)in_stack_fffffffffffffc78;
        std::
        sort_heap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,__comp_00);
        return;
      }
      in_stack_fffffffffffffc78 = in_RDX;
      in_stack_fffffffffffffc80._M_current = in_RCX._M_current;
      if (0x17 < dVar5) {
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                    (difference_type)in_stack_fffffffffffffc50._M_current);
        __b._M_current._7_1_ = in_stack_fffffffffffffc4f;
        __b._M_current._0_7_ = in_stack_fffffffffffffc48;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffc50,__b);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                    (difference_type)in_stack_fffffffffffffc50._M_current);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                    (difference_type)in_stack_fffffffffffffc50._M_current);
        __b_00._M_current._7_1_ = in_stack_fffffffffffffc4f;
        __b_00._M_current._0_7_ = in_stack_fffffffffffffc48;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffc50,__b_00);
        in_stack_fffffffffffffc78 = in_RDX;
        in_stack_fffffffffffffc80._M_current = in_RCX._M_current;
        if (0x80 < dVar5) {
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                      (difference_type)in_stack_fffffffffffffc50._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                      (difference_type)in_stack_fffffffffffffc50._M_current);
          __b_01._M_current._7_1_ = in_stack_fffffffffffffc4f;
          __b_01._M_current._0_7_ = in_stack_fffffffffffffc48;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffc50,__b_01);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                      (difference_type)in_stack_fffffffffffffc50._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                      (difference_type)in_stack_fffffffffffffc50._M_current);
          __b_02._M_current._7_1_ = in_stack_fffffffffffffc4f;
          __b_02._M_current._0_7_ = in_stack_fffffffffffffc48;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffc50,__b_02);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                      (difference_type)in_stack_fffffffffffffc50._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                      (difference_type)in_stack_fffffffffffffc50._M_current);
          __b_03._M_current._7_1_ = in_stack_fffffffffffffc4f;
          __b_03._M_current._0_7_ = in_stack_fffffffffffffc48;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffc50,__b_03);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                      (difference_type)in_stack_fffffffffffffc50._M_current);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                      (difference_type)in_stack_fffffffffffffc50._M_current);
          __b_04._M_current._7_1_ = in_stack_fffffffffffffc4f;
          __b_04._M_current._0_7_ = in_stack_fffffffffffffc48;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffc50,__b_04);
          in_stack_fffffffffffffc78 = in_RDX;
          in_stack_fffffffffffffc80._M_current = in_RCX._M_current;
        }
      }
      if (0x17 < (long)pFVar6) {
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                    (difference_type)in_stack_fffffffffffffc50._M_current);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                    (difference_type)in_stack_fffffffffffffc50._M_current);
        __b_05._M_current._7_1_ = in_stack_fffffffffffffc4f;
        __b_05._M_current._0_7_ = in_stack_fffffffffffffc48;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffc50,__b_05);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                    (difference_type)in_stack_fffffffffffffc50._M_current);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                    (difference_type)in_stack_fffffffffffffc50._M_current);
        __b_06._M_current._7_1_ = in_stack_fffffffffffffc4f;
        __b_06._M_current._0_7_ = in_stack_fffffffffffffc48;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (in_stack_fffffffffffffc50,__b_06);
        if (0x80 < (long)pFVar6) {
          in_stack_fffffffffffffd10 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                           in_stack_fffffffffffffc50._M_current);
          in_stack_fffffffffffffd08 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                           in_stack_fffffffffffffc50._M_current);
          __b_07._M_current._7_1_ = in_stack_fffffffffffffc4f;
          __b_07._M_current._0_7_ = in_stack_fffffffffffffc48;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffc50,__b_07);
          in_stack_fffffffffffffd00 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                           in_stack_fffffffffffffc50._M_current);
          in_stack_fffffffffffffcf8 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                           in_stack_fffffffffffffc50._M_current);
          __b_08._M_current._7_1_ = in_stack_fffffffffffffc4f;
          __b_08._M_current._0_7_ = in_stack_fffffffffffffc48;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffc50,__b_08);
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                       *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                      (difference_type)in_stack_fffffffffffffc50._M_current);
          in_stack_fffffffffffffce8 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                           in_stack_fffffffffffffc50._M_current);
          __b_09._M_current._7_1_ = in_stack_fffffffffffffc4f;
          __b_09._M_current._0_7_ = in_stack_fffffffffffffc48;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffc50,__b_09);
          in_stack_fffffffffffffce0 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                           in_stack_fffffffffffffc50._M_current);
          in_stack_fffffffffffffcd8 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                           in_stack_fffffffffffffc50._M_current);
          __b_10._M_current._7_1_ = in_stack_fffffffffffffc4f;
          __b_10._M_current._0_7_ = in_stack_fffffffffffffc48;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                    (in_stack_fffffffffffffc50,__b_10);
        }
      }
    }
    else {
      bVar1 = false;
      in_stack_fffffffffffffc78 = in_RDX;
      in_stack_fffffffffffffc80._M_current = in_RCX._M_current;
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        comp_08.this = (HighsTableauSeparator *)in_stack_fffffffffffffcd8._M_current;
        comp_08.edgeWt = (double **)local_8._M_current;
        in_stack_fffffffffffffcc8._M_current = _Var4._M_current;
        in_stack_fffffffffffffcd0._M_current = local_8._M_current;
        bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                          (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,comp_08);
        bVar1 = false;
        in_stack_fffffffffffffcb8._M_current = in_RDX;
        in_stack_fffffffffffffcc0._M_current = in_RCX._M_current;
        if (bVar2) {
          in_stack_fffffffffffffca0 = in_stack_fffffffffffffc80._M_current;
          in_stack_fffffffffffffca8 = in_RSI._M_current;
          in_stack_fffffffffffffcb0 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                           in_stack_fffffffffffffc50._M_current);
          comp_09.this = (HighsTableauSeparator *)in_stack_fffffffffffffcd8._M_current;
          comp_09.edgeWt = (double **)in_stack_fffffffffffffcd0._M_current;
          in_stack_fffffffffffffc80._M_current = in_stack_fffffffffffffca0;
          in_RSI._M_current = in_stack_fffffffffffffca8;
          bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
                            (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,comp_09);
          in_stack_fffffffffffffcb8._M_current = in_RDX;
          in_stack_fffffffffffffcc0._M_current = in_RCX._M_current;
        }
      }
      if (bVar1 != false) {
        return;
      }
      in_stack_fffffffffffffc4f = 0;
    }
    comp_11.edgeWt._4_4_ = in_R8D;
    comp_11.edgeWt._0_4_ = uVar8;
    comp_11.this = (HighsTableauSeparator *)in_stack_fffffffffffffc78;
    in_stack_fffffffffffffc90._M_current = local_8._M_current;
    in_RDX = in_stack_fffffffffffffc78;
    in_RCX._M_current = in_stack_fffffffffffffc80._M_current;
    pdqsort_loop<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0,false>
              (in_RSI,in_stack_fffffffffffffc80,comp_11,(int)((ulong)dVar3 >> 0x20),
               SUB81((ulong)dVar3 >> 0x18,0));
    local_8 = __gnu_cxx::
              __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
              ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                           *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                          in_stack_fffffffffffffc50._M_current);
    uVar8 = uVar8 & 0xffffff;
    in_stack_fffffffffffffc88._M_current = _Var4._M_current;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }